

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O3

int __thiscall
soplex::SPxFastRT<double>::minSelect
          (SPxFastRT<double> *this,double *val,double *stab,double *best,double *bestDelta,
          double max,UpdateVector<double> *update,VectorBase<double> *lowBound,
          VectorBase<double> *upBound,int start,int incr)

{
  double *pdVar1;
  Type TVar2;
  int iVar3;
  uint uVar4;
  pointer pdVar5;
  int *piVar6;
  pointer pdVar7;
  SPxSolverBase<double> *pSVar8;
  SPxId *pSVar9;
  int iVar10;
  ulong uVar11;
  pointer pdVar12;
  pointer pdVar13;
  uint *puVar14;
  DataArray<soplex::SPxBasisBase<double>::Desc::Status> *pDVar15;
  bool bVar16;
  double dVar17;
  uint local_b0;
  uint local_ac;
  DataKey local_50;
  double local_48;
  undefined8 uStack_40;
  
  TVar2 = (this->super_SPxRatioTester<double>).m_type;
  if (TVar2 == LEAVE) {
    bVar16 = false;
  }
  else {
    bVar16 = ((this->super_SPxRatioTester<double>).thesolver)->theRep == ROW;
  }
  iVar3 = (update->thedelta).super_IdxSet.num;
  local_ac = 0xffffffff;
  if (start < iVar3) {
    pdVar13 = (upBound->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar12 = (lowBound->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar5 = (update->super_VectorBase<double>).val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    piVar6 = (update->thedelta).super_IdxSet.idx;
    pdVar7 = (update->thedelta).super_VectorBase<double>.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    puVar14 = (uint *)(piVar6 + start);
    local_b0 = 0xffffffff;
    local_ac = 0xffffffff;
    do {
      uVar4 = *puVar14;
      local_48 = pdVar7[(int)uVar4];
      if (TVar2 == LEAVE) {
        pSVar8 = (this->super_SPxRatioTester<double>).thesolver;
        if (this->iscoid == true) {
          pDVar15 = (pSVar8->super_SPxBasisBase<double>).thedesc.costat;
        }
        else {
          pDVar15 = (pSVar8->super_SPxBasisBase<double>).thedesc.stat;
        }
        if (pSVar8->theRep * pDVar15->data[(int)uVar4] < 1) goto LAB_0023a522;
      }
      else {
LAB_0023a522:
        if (bVar16) {
          pSVar8 = (this->super_SPxRatioTester<double>).thesolver;
          pSVar9 = (pSVar8->super_SPxBasisBase<double>).theBaseId.data;
          if (0 < pSVar9[(int)uVar4].super_DataKey.info) {
            uStack_40 = 0;
            SPxColId::SPxColId((SPxColId *)&local_50,pSVar9 + (int)uVar4);
            iVar10 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                               (&(pSVar8->super_SPxLPBase<double>).super_LPColSetBase<double>.
                                 super_SVSetBase<double>.set,&local_50);
            if ((pSVar8->super_SPxBasisBase<double>).thedesc.colstat.data[iVar10] == P_FIXED)
            goto LAB_0023a625;
          }
        }
        if (local_48 <= *stab) {
          if (local_48 < -*stab) {
            dVar17 = (pdVar13[(int)uVar4] - pdVar5[(int)uVar4]) / local_48;
            if (dVar17 < max) goto LAB_0023a5f6;
            *val = dVar17;
            *stab = -local_48;
            local_ac = uVar4;
          }
        }
        else {
          dVar17 = (pdVar12[(int)uVar4] - pdVar5[(int)uVar4]) / local_48;
          if (dVar17 < max) {
LAB_0023a5f6:
            if (dVar17 < *best) {
              *best = dVar17;
              local_b0 = uVar4;
            }
          }
          else {
            *val = dVar17;
            *stab = local_48;
            local_ac = uVar4;
          }
        }
      }
LAB_0023a625:
      puVar14 = puVar14 + incr;
    } while (puVar14 < piVar6 + iVar3);
    if (0 < (int)local_b0 && (int)local_ac < 0) {
      uVar11 = (ulong)local_b0;
      pdVar1 = pdVar7 + uVar11;
      if (0.0 < *pdVar1 || *pdVar1 == 0.0) {
        pdVar13 = pdVar5;
      }
      if (!NAN(*pdVar1) && (0.0 >= *pdVar1 && *pdVar1 != 0.0)) {
        pdVar12 = pdVar5;
      }
      *bestDelta = pdVar13[uVar11] - pdVar12[uVar11];
    }
  }
  return local_ac;
}

Assistant:

int SPxFastRT<R>::minSelect(
   R& val,
   R& stab,
   R& best,
   R& bestDelta,
   R max,
   const UpdateVector<R>& update,
   const VectorBase<R>& lowBound,
   const VectorBase<R>& upBound,
   int start,
   int incr) const
{
   int i;
   R x, y;
   bool leaving = this->m_type == SPxSolverBase<R>::LEAVE;
   bool enterrowrep = !leaving && this->thesolver->theRep == SPxSolverBase<R>::ROW;

   const R* up = upBound.get_const_ptr();
   const R* low = lowBound.get_const_ptr();
   const R* vec = update.get_const_ptr();
   const R* upd = update.delta().values();
   const int* idx = update.delta().indexMem();
   const int* last = idx + update.delta().size();

   int nr = -1;
   int bestNr = -1;

   for(idx += start; idx < last; idx += incr)
   {
      i = *idx;
      x = upd[i];

      // in the dual algorithm, bound flips cannot happen, hence we only consider nonbasic variables
      if(leaving && ((iscoid && this->thesolver->isCoBasic(i)) || (!iscoid
                     && this->thesolver->isBasic(i))))
         continue;

      if(enterrowrep && this->thesolver->baseId(i).isSPxColId()
            && this->thesolver->desc().colStatus(this->thesolver->number(SPxColId(this->thesolver->baseId(i))))
            == SPxBasisBase<R>::Desc::P_FIXED)
         continue;

      if(x > stab)
      {
         y = (low[i] - vec[i]) / x;

         if(y >= max)
         {
            val = y;
            nr = i;
            stab = x;
         }
         else if(y < best)
         {
            best = y;
            bestNr = i;
         }
      }
      else if(x < -stab)
      {
         y = (up[i] - vec[i]) / x;

         if(y >= max)
         {
            val = y;
            nr = i;
            stab = -x;
         }
         else if(y < best)
         {
            best = y;
            bestNr = i;
         }
      }
   }

   if(nr < 0 && bestNr > 0)
   {
      if(upd[bestNr] < 0)
         bestDelta = up[bestNr] - vec[bestNr];
      else
         bestDelta = vec[bestNr] - low[bestNr];
   }

   return nr;
}